

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseRspOffsetElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  Token *pTVar1;
  int64_t iVar2;
  Identifier local_a8;
  int64_t local_78;
  string local_70;
  Identifier local_50;
  Token *local_30;
  Token *token;
  MipsRegisterValue *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  dest->type = RspOffsetElement;
  token = (Token *)dest;
  dest_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  pTVar1 = Parser::peekToken(parser,0);
  if (pTVar1->type == LBrack) {
    Parser::eatToken((Parser *)dest_local);
    local_30 = Parser::nextToken((Parser *)dest_local);
    if ((local_30->type == Integer) && (iVar2 = Token::intValue(local_30), iVar2 < 0x10)) {
      local_78 = Token::intValue(local_30);
      tinyformat::format<long>(&local_70,"%d",&local_78);
      Identifier::Identifier(&local_50,&local_70);
      Identifier::operator=((Identifier *)&token->column,&local_50);
      Identifier::~Identifier(&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      iVar2 = Token::intValue(local_30);
      *(int *)((long)&(token->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
              + 0x10) = (int)iVar2;
      pTVar1 = Parser::nextToken((Parser *)dest_local);
      return pTVar1->type == RBrack;
    }
    this_local._7_1_ = false;
  }
  else {
    *(undefined4 *)
     ((long)&(token->value).
             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier> +
     0x10) = 0;
    memset(&local_a8,0,0x20);
    Identifier::Identifier(&local_a8);
    Identifier::operator=((Identifier *)&token->column,&local_a8);
    Identifier::~Identifier(&local_a8);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseRspOffsetElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspOffsetElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		parser.eatToken();

		const Token &token = parser.nextToken();

		if (token.type != TokenType::Integer || token.intValue() >= 16)
			return false;

		dest.name = Identifier(tfm::format("%d", token.intValue()));
		dest.num = (int)token.intValue();

		return parser.nextToken().type == TokenType::RBrack;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;
}